

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O0

FSerializer * Serialize<FFont>(FSerializer *arc,char *key,FFont **font,FFont **def)

{
  bool bVar1;
  FFont *pFVar2;
  char *local_40;
  char *n_1;
  char *n;
  FFont **def_local;
  FFont **font_local;
  char *key_local;
  FSerializer *arc_local;
  
  n = (char *)def;
  def_local = font;
  font_local = (FFont **)key;
  key_local = (char *)arc;
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    n_1 = FFont::GetName(*def_local);
    arc_local = FSerializer::StringPtr((FSerializer *)key_local,(char *)font_local,&n_1);
  }
  else {
    FSerializer::StringPtr((FSerializer *)key_local,(char *)font_local,&local_40);
    pFVar2 = V_GetFont(local_40);
    *def_local = pFVar2;
    if (*def_local == (FFont *)0x0) {
      Printf("\x1cICould not load font %s\n",local_40);
      *def_local = SmallFont;
    }
    arc_local = (FSerializer *)key_local;
  }
  return arc_local;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FFont *&font, FFont **def)
{
	if (arc.isWriting())
	{
		const char *n = font->GetName();
		return arc.StringPtr(key, n);
	}
	else
	{
		const char *n;
		arc.StringPtr(key, n);
		font = V_GetFont(n);
		if (font == nullptr)
		{
			Printf(TEXTCOLOR_ORANGE "Could not load font %s\n", n);
			font = SmallFont;
		}
		return arc;
	}

}